

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall Thread::~Thread(Thread *this)

{
  if ((this->started_ == true) && (this->joined_ == false)) {
    pthread_detach(this->pthreadId_);
  }
  CountDownLatch::~CountDownLatch(&this->latch_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::_Function_base::~_Function_base(&(this->func_).super__Function_base);
  return;
}

Assistant:

Thread::~Thread() {
    if(started_ && !joined_) pthread_detach(pthreadId_);
}